

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O2

void __thiscall Fl_Table::damage_zone(Fl_Table *this,int r1,int c1,int r2,int c2,int r3,int c3)

{
  int topRow;
  int botRow;
  int iVar1;
  int R2;
  int C1;
  int R1;
  int C2;
  int rightCol;
  int iVar2;
  
  iVar1 = r2;
  if (r2 < r1) {
    iVar1 = r1;
  }
  if (r1 < r2) {
    r2 = r1;
  }
  if (iVar1 <= r3) {
    iVar1 = r3;
  }
  if (r3 <= r2) {
    r2 = r3;
  }
  iVar2 = c2;
  if (c2 < c1) {
    iVar2 = c1;
  }
  if (c1 < c2) {
    c2 = c1;
  }
  if (iVar2 <= c3) {
    iVar2 = c3;
  }
  if (c3 <= c2) {
    c2 = c3;
  }
  if (((-1 < r2) || (r2 = 0, -1 < iVar1)) && ((-1 < c2 || (c2 = 0, -1 < iVar2)))) {
    topRow = this->toprow;
    if (this->toprow < r2) {
      topRow = r2;
    }
    botRow = this->botrow;
    if (iVar1 < this->botrow) {
      botRow = iVar1;
    }
    iVar1 = this->leftcol;
    if (this->leftcol < c2) {
      iVar1 = c2;
    }
    rightCol = this->rightcol;
    if (iVar2 < this->rightcol) {
      rightCol = iVar2;
    }
    redraw_range(this,topRow,botRow,iVar1,rightCol);
    return;
  }
  return;
}

Assistant:

void Fl_Table::damage_zone(int r1, int c1, int r2, int c2, int r3, int c3) {
  int R1 = r1, C1 = c1;
  int R2 = r2, C2 = c2;
  if (r1 > R2) R2 = r1;
  if (r2 < R1) R1 = r2;
  if (r3 > R2) R2 = r3;
  if (r3 < R1) R1 = r3;
  if (c1 > C2) C2 = c1;
  if (c2 < C1) C1 = c2;
  if (c3 > C2) C2 = c3;
  if (c3 < C1) C1 = c3;
  if (R1 < 0) {
    if (R2 < 0) return;
    R1 = 0;
  }
  if (C1 < 0) {
    if (C2 < 0) return;
    C1 = 0;
  }
  if (R1 < toprow) R1 = toprow;
  if (R2 > botrow) R2 = botrow;
  if (C1 < leftcol) C1 = leftcol;
  if (C2 > rightcol) C2 = rightcol;
  redraw_range(R1, R2, C1, C2);
}